

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XPMPMultiplayer.cpp
# Opt level: O2

int XPMPChangePlaneModel(XPMPPlaneID _id,char *inICAO,char *inAirline,char *inLivery)

{
  int iVar1;
  Aircraft *this;
  char *__s;
  allocator<char> local_8b;
  allocator<char> local_8a;
  allocator<char> local_89;
  string local_88;
  string local_68;
  string local_48;
  
  this = XPMP2::AcFindByID(0);
  if (this == (Aircraft *)0x0) {
    iVar1 = -1;
  }
  else {
    if (inICAO == (char *)0x0) {
      inICAO = "";
    }
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,inICAO,&local_89);
    if (inAirline == (char *)0x0) {
      inAirline = "";
    }
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,inAirline,&local_8a);
    __s = "";
    if (inLivery != (char *)0x0) {
      __s = inLivery;
    }
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,__s,&local_8b);
    iVar1 = XPMP2::Aircraft::ChangeModel(this,&local_48,&local_68,&local_88);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)&local_48);
  }
  return iVar1;
}

Assistant:

int     XPMPChangePlaneModel(XPMPPlaneID            _id,
                             const char *           inICAO,
                             const char *           inAirline,
                             const char *           inLivery)
{
    Aircraft* pAc = AcFindByID(_id);
    if (pAc)
        return pAc->ChangeModel(inICAO      ? inICAO : "",
                                inAirline   ? inAirline : "",
                                inLivery    ? inLivery : "");
    else
        return -1;
}